

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

void __thiscall
Json::Reader::getLocationLineAndColumn(Reader *this,Location location,int *line,int *column)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  pcVar2 = this->begin_;
  *line = 0;
  if ((pcVar2 < location) && (pcVar4 = pcVar2, pcVar2 != this->end_)) {
    do {
      pcVar1 = pcVar2 + 1;
      if (*pcVar2 == '\n') {
LAB_0087a013:
        pcVar4 = pcVar1;
        *line = *line + 1;
        pcVar1 = pcVar4;
      }
      else if (*pcVar2 == '\r') {
        if (pcVar2[1] == '\n') {
          pcVar1 = pcVar2 + 2;
        }
        goto LAB_0087a013;
      }
      pcVar2 = pcVar1;
      iVar3 = (int)pcVar4;
    } while ((pcVar2 < location) && (pcVar2 != this->end_));
  }
  else {
    iVar3 = (int)pcVar2;
  }
  *column = ((int)location - iVar3) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void Reader::getLocationLineAndColumn(Location location, int& line,
                                      int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (*current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}